

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitArrayNew(OptimizeInstructions *this,ArrayNew *curr)

{
  bool bVar1;
  int32_t iVar2;
  Module *wasm;
  ArrayNewFixed *rep;
  Drop *left;
  Block *rep_00;
  optional<wasm::Type> type_00;
  bool local_fa;
  bool local_e2;
  undefined1 local_e0 [12];
  Expression *local_d0;
  Expression *init;
  Literal local_c0;
  Expression *local_98;
  Expression *value;
  undefined1 local_88 [8];
  Literal zero;
  HeapType local_68 [2];
  Type local_58;
  Type type;
  initializer_list<wasm::Expression_*> local_48;
  uintptr_t local_38;
  Const *local_30;
  Const *c;
  Builder builder;
  ArrayNew *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  local_e2 = true;
  if (!bVar1) {
    local_e2 = ArrayNew::isWithDefault(curr);
  }
  if (local_e2 == false) {
    wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
    Builder::Builder((Builder *)&c,wasm);
    local_30 = Expression::dynCast<wasm::Const>(curr->size);
    if ((local_30 == (Const *)0x0) || (iVar2 = wasm::Literal::geti32(&local_30->value), iVar2 != 1))
    {
      zero.type.id = (uintptr_t)
                     wasm::Type::getHeapType
                               (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).
                                 super_Expression.type);
      HeapType::getArray(local_68);
      local_58.id = local_68[0].id;
      bVar1 = wasm::Type::isDefaultable(&local_58);
      if (bVar1) {
        value = (Expression *)local_58.id;
        wasm::Literal::makeZero((Literal *)local_88,local_58);
        local_98 = getFallthrough(this,curr->init);
        init._7_1_ = 0;
        bVar1 = Properties::isSingleConstantExpression(local_98);
        local_fa = true;
        if (bVar1) {
          Properties::getLiteral(&local_c0,local_98);
          init._7_1_ = 1;
          local_fa = wasm::Literal::operator!=(&local_c0,(Literal *)local_88);
        }
        if ((init._7_1_ & 1) != 0) {
          wasm::Literal::~Literal(&local_c0);
        }
        if (local_fa == false) {
          local_d0 = curr->init;
          curr->init = (Expression *)0x0;
          bVar1 = ArrayNew::isWithDefault(curr);
          if (!bVar1) {
            __assert_fail("curr->isWithDefault()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                          ,0x84b,"void wasm::OptimizeInstructions::visitArrayNew(ArrayNew *)");
          }
          left = Builder::makeDrop((Builder *)&c,local_d0);
          std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_e0);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._12_4_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)local_e0._0_8_;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_e0[8];
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_3_ = local_e0._9_3_;
          rep_00 = Builder::makeSequence
                             ((Builder *)&c,(Expression *)left,(Expression *)curr,type_00);
          replaceCurrent(this,(Expression *)rep_00);
          init._0_4_ = 0;
        }
        else {
          init._0_4_ = 1;
        }
        wasm::Literal::~Literal((Literal *)local_88);
      }
    }
    else {
      local_38 = (uintptr_t)
                 wasm::Type::getHeapType
                           (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).
                             super_Expression.type);
      type.id = (uintptr_t)curr->init;
      local_48._M_array = (iterator)&type;
      local_48._M_len = 1;
      rep = Builder::makeArrayNewFixed((Builder *)&c,(HeapType)local_38,&local_48);
      replaceCurrent(this,(Expression *)rep);
    }
  }
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    // If a value is provided, we can optimize in some cases.
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    Builder builder(*getModule());

    // ArrayNew of size 1 is less efficient than ArrayNewFixed with one value
    // (the latter avoids a Const, which ends up saving one byte).
    // TODO: also look at the case with a fallthrough or effects on the size
    if (auto* c = curr->size->dynCast<Const>()) {
      if (c->value.geti32() == 1) {
        // Optimize to ArrayNewFixed. Note that if the value is the default
        // then we may end up optimizing further in visitArrayNewFixed.
        replaceCurrent(
          builder.makeArrayNewFixed(curr->type.getHeapType(), {curr->init}));
        return;
      }
    }

    // If the type is defaultable then perhaps the value here is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (!type.isDefaultable()) {
      return;
    }

    // The value must be the default/zero.
    auto zero = Literal::makeZero(type);
    auto* value = getFallthrough(curr->init);
    if (!Properties::isSingleConstantExpression(value) ||
        Properties::getLiteral(value) != zero) {
      return;
    }

    // Success! Drop the init and return an array.new_with_default.
    auto* init = curr->init;
    curr->init = nullptr;
    assert(curr->isWithDefault());
    replaceCurrent(builder.makeSequence(builder.makeDrop(init), curr));
  }